

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nanoflann.hpp
# Opt level: O3

void __thiscall
nanoflann::
KDTreeBaseClass<nanoflann::KDTreeSingleIndexAdaptor<nanoflann::L2_Simple_Adaptor<double,_anurbs::PointOnSurfaceProjection<3L>::PointCloudAdaptor,_double>,_anurbs::PointOnSurfaceProjection<3L>::PointCloudAdaptor,_3,_unsigned_long>,_nanoflann::L2_Simple_Adaptor<double,_anurbs::PointOnSurfaceProjection<3L>::PointCloudAdaptor,_double>,_anurbs::PointOnSurfaceProjection<3L>::PointCloudAdaptor,_3,_unsigned_long>
::planeSplit(KDTreeBaseClass<nanoflann::KDTreeSingleIndexAdaptor<nanoflann::L2_Simple_Adaptor<double,_anurbs::PointOnSurfaceProjection<3L>::PointCloudAdaptor,_double>,_anurbs::PointOnSurfaceProjection<3L>::PointCloudAdaptor,_3,_unsigned_long>,_nanoflann::L2_Simple_Adaptor<double,_anurbs::PointOnSurfaceProjection<3L>::PointCloudAdaptor,_double>,_anurbs::PointOnSurfaceProjection<3L>::PointCloudAdaptor,_3,_unsigned_long>
             *this,KDTreeSingleIndexAdaptor<nanoflann::L2_Simple_Adaptor<double,_anurbs::PointOnSurfaceProjection<3L>::PointCloudAdaptor,_double>,_anurbs::PointOnSurfaceProjection<3L>::PointCloudAdaptor,_3,_unsigned_long>
                   *obj,unsigned_long *ind,unsigned_long count,int cutfeat,DistanceType *cutval,
            unsigned_long *lim1,unsigned_long *lim2)

{
  double *pdVar1;
  double dVar2;
  pointer pPVar3;
  unsigned_long uVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  bool bVar9;
  
  uVar5 = count - 1;
  uVar7 = 0;
  lVar6 = (ulong)(uint)cutfeat * 8;
  uVar8 = uVar5;
  do {
    if (uVar7 <= uVar8) {
      if (2 < (uint)cutfeat) goto LAB_001c06ad;
      do {
        pdVar1 = (double *)
                 ((long)&(obj->dataset->m_points->
                         super__Vector_base<anurbs::PointOnSurfaceProjection<3L>::ParameterPoint,_std::allocator<anurbs::PointOnSurfaceProjection<3L>::ParameterPoint>_>
                         )._M_impl.super__Vector_impl_data._M_start[ind[uVar7]].point.
                         super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage +
                 lVar6);
        if (*cutval < *pdVar1 || *cutval == *pdVar1) break;
        uVar7 = uVar7 + 1;
      } while (uVar7 <= uVar8);
    }
    bVar9 = uVar8 != 0;
    if (uVar7 <= uVar8 && uVar8 != 0) {
      if (2 < (uint)cutfeat) goto LAB_001c06ad;
      pPVar3 = (obj->dataset->m_points->
               super__Vector_base<anurbs::PointOnSurfaceProjection<3L>::ParameterPoint,_std::allocator<anurbs::PointOnSurfaceProjection<3L>::ParameterPoint>_>
               )._M_impl.super__Vector_impl_data._M_start;
      dVar2 = *(double *)
               ((long)&pPVar3[ind[uVar8]].point.
                       super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage +
               lVar6);
      while (bVar9 = true, *cutval <= dVar2) {
        uVar8 = uVar8 - 1;
        bVar9 = uVar8 != 0;
        if ((uVar8 < uVar7) || (!bVar9)) break;
        dVar2 = *(double *)
                 ((long)&pPVar3[ind[uVar8]].point.
                         super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage +
                 lVar6);
      }
    }
    if ((uVar8 < uVar7) || (!bVar9)) break;
    uVar4 = ind[uVar7];
    ind[uVar7] = ind[uVar8];
    ind[uVar8] = uVar4;
    uVar7 = uVar7 + 1;
    uVar8 = uVar8 - 1;
  } while( true );
  *lim1 = uVar7;
  do {
    if (uVar7 <= uVar5) {
      if (2 < (uint)cutfeat) {
LAB_001c06ad:
        __assert_fail("index >= 0 && index < size()",
                      "/workspace/llm4binary/github/license_c_cmakelists/oberbichler[P]ANurbs/external_libraries/Eigen/src/Core/DenseCoeffsBase.h"
                      ,0xa2,
                      "CoeffReturnType Eigen::DenseCoeffsBase<Eigen::Matrix<double, 1, 3>, 0>::operator[](Index) const [Derived = Eigen::Matrix<double, 1, 3>, Level = 0]"
                     );
      }
      do {
        if (*cutval < *(double *)
                       ((long)&(obj->dataset->m_points->
                               super__Vector_base<anurbs::PointOnSurfaceProjection<3L>::ParameterPoint,_std::allocator<anurbs::PointOnSurfaceProjection<3L>::ParameterPoint>_>
                               )._M_impl.super__Vector_impl_data._M_start[ind[uVar7]].point.
                               super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.
                               m_storage + lVar6)) break;
        uVar7 = uVar7 + 1;
      } while (uVar7 <= uVar5);
    }
    bVar9 = uVar5 != 0;
    if ((uVar7 <= uVar5) && (uVar5 != 0)) {
      if (2 < (uint)cutfeat) goto LAB_001c06ad;
      pPVar3 = (obj->dataset->m_points->
               super__Vector_base<anurbs::PointOnSurfaceProjection<3L>::ParameterPoint,_std::allocator<anurbs::PointOnSurfaceProjection<3L>::ParameterPoint>_>
               )._M_impl.super__Vector_impl_data._M_start;
      dVar2 = *(double *)
               ((long)&pPVar3[ind[uVar5]].point.
                       super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage +
               lVar6);
      while (bVar9 = true, *cutval < dVar2) {
        uVar5 = uVar5 - 1;
        bVar9 = uVar5 != 0;
        if ((uVar5 < uVar7) || (!bVar9)) break;
        dVar2 = *(double *)
                 ((long)&pPVar3[ind[uVar5]].point.
                         super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage +
                 lVar6);
      }
    }
    if ((uVar5 < uVar7) || (!bVar9)) {
      *lim2 = uVar7;
      return;
    }
    uVar4 = ind[uVar7];
    ind[uVar7] = ind[uVar5];
    ind[uVar5] = uVar4;
    uVar7 = uVar7 + 1;
    uVar5 = uVar5 - 1;
  } while( true );
}

Assistant:

void planeSplit(Derived &obj, IndexType *ind, const IndexType count,
                  int cutfeat, DistanceType &cutval, IndexType &lim1,
                  IndexType &lim2) {
    /* Move vector indices for left subtree to front of list. */
    IndexType left = 0;
    IndexType right = count - 1;
    for (;;) {
      while (left <= right && dataset_get(obj, ind[left], cutfeat) < cutval)
        ++left;
      while (right && left <= right &&
             dataset_get(obj, ind[right], cutfeat) >= cutval)
        --right;
      if (left > right || !right)
        break; // "!right" was added to support unsigned Index types
      std::swap(ind[left], ind[right]);
      ++left;
      --right;
    }
    /* If either list is empty, it means that all remaining features
     * are identical. Split in the middle to maintain a balanced tree.
     */
    lim1 = left;
    right = count - 1;
    for (;;) {
      while (left <= right && dataset_get(obj, ind[left], cutfeat) <= cutval)
        ++left;
      while (right && left <= right &&
             dataset_get(obj, ind[right], cutfeat) > cutval)
        --right;
      if (left > right || !right)
        break; // "!right" was added to support unsigned Index types
      std::swap(ind[left], ind[right]);
      ++left;
      --right;
    }
    lim2 = left;
  }